

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::PoolAllocator::~PoolAllocator(PoolAllocator *this)

{
  pthread_mutex_t *ppVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong extraout_RAX;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *ppVar4;
  pthread_mutex_t *local_28;
  pthread_mutex_t *local_20;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_00609ba8;
  clear(this);
  __mutex = (pthread_mutex_t *)this->d;
  ppVar4 = *(pthread_mutex_t **)(__mutex + 3);
  if ((*(pthread_mutex_t **)(__mutex + 3) == __mutex + 3) ||
     (~PoolAllocator((PoolAllocator *)&this->d), __mutex = local_28, ppVar4 = local_20,
     (extraout_RAX & 1) != 0)) {
    while (ppVar4 != __mutex + 3) {
      ppVar1 = (pthread_mutex_t *)ppVar4->__align;
      operator_delete(ppVar4,0x20);
      ppVar4 = ppVar1;
    }
    puVar3 = *(undefined8 **)((long)__mutex + 0x60);
    while (puVar3 != (undefined8 *)((long)__mutex + 0x60)) {
      puVar2 = (undefined8 *)*puVar3;
      operator_delete(puVar3,0x20);
      puVar3 = puVar2;
    }
    pthread_mutex_destroy(__mutex + 1);
    pthread_mutex_destroy(__mutex);
  }
  else {
    __mutex = (pthread_mutex_t *)0x0;
  }
  operator_delete(__mutex,0x90);
  return;
}

Assistant:

PoolAllocator::~PoolAllocator()
{
    clear();

    if (!d->payouts.empty())
    {
        NCNN_LOGE("FATAL ERROR! pool allocator destroyed too early");
#if NCNN_STDIO
        std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
        for (; it != d->payouts.end(); ++it)
        {
            void* ptr = it->second;
            NCNN_LOGE("%p still in use", ptr);
        }
#endif
    }

    delete d;
}